

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O1

void is_seq<float>(float *array,int stride,long count,long expected_start)

{
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  stringstream *this;
  char *message;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  uint local_68;
  int local_64;
  internal local_60 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  ulong local_50;
  long local_48;
  long local_40;
  AssertHelper local_38;
  
  if (0 < count) {
    local_50 = (ulong)(uint)stride;
    lVar3 = 0;
    local_68 = 0;
    local_64 = stride;
    local_48 = expected_start;
    local_40 = count;
    do {
      if (0 < local_64) {
        pbVar1 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (lVar3 + local_48);
        uVar5 = local_50;
        uVar4 = local_68;
        do {
          local_70.ptr_ = pbVar1;
          testing::internal::CmpHelperEQ<float,long>
                    (local_60,"array[output_index + j]","expected_start + i",array + uVar4,
                     (long *)&local_70);
          if (local_60[0] == (internal)0x0) {
            this = (stringstream *)operator_new(0x188);
            std::__cxx11::stringstream::stringstream(this);
            *(undefined8 *)(this + *(long *)(*(long *)(this + 0x10) + -0x18) + 0x18) = 0x11;
            if (local_58.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              message = "";
            }
            else {
              message = ((local_58.ptr_)->_M_dataplus)._M_p;
            }
            local_70.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
            testing::internal::AssertHelper::AssertHelper
                      (&local_38,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_resampler.cpp"
                       ,0x290,message);
            testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_70);
            testing::internal::AssertHelper::~AssertHelper(&local_38);
            if (local_70.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              bVar2 = testing::internal::IsTrue(true);
              if ((bVar2) &&
                 (local_70.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
                (**(code **)(*(long *)local_70.ptr_ + 8))();
              }
              local_70.ptr_ =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_58,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            return;
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
          uVar4 = uVar4 + 1;
          uVar5 = uVar5 - 1;
        } while (uVar5 != 0);
      }
      local_68 = local_68 + local_64;
      lVar3 = lVar3 + 1;
    } while (lVar3 != local_40);
  }
  return;
}

Assistant:

void is_seq(T * array, int stride, long count, long expected_start)
{
  uint32_t output_index = 0;
  for (long i = 0; i < count; i++) {
    for (int j = 0; j < stride; j++) {
      ASSERT_EQ(array[output_index + j], expected_start + i);
    }
    output_index += stride;
  }
}